

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImDrawList * __thiscall ImDrawList::CloneOutput(ImDrawList *this)

{
  ImDrawListSharedData *pIVar1;
  ImDrawList *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  undefined1 auVar3 [32];
  
  this_00 = (ImDrawList *)ImGui::MemAlloc(200);
  pIVar1 = this->_Data;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  auVar2 = auVar3._0_16_;
  (this_00->VtxBuffer).Size = auVar2._0_4_;
  (this_00->VtxBuffer).Capacity = auVar2._4_4_;
  (this_00->VtxBuffer).Data = (ImDrawVert *)auVar2._8_8_;
  this_00->Flags = auVar3._16_4_;
  this_00->_VtxCurrentIdx = auVar3._20_4_;
  this_00->_Data = (ImDrawListSharedData *)auVar3._24_8_;
  auVar2 = auVar3._0_16_;
  auVar4 = auVar3._16_16_;
  (this_00->CmdBuffer).Size = auVar2._0_4_;
  (this_00->CmdBuffer).Capacity = auVar2._4_4_;
  (this_00->CmdBuffer).Data = (ImDrawCmd *)auVar2._8_8_;
  (this_00->IdxBuffer).Size = auVar4._0_4_;
  (this_00->IdxBuffer).Capacity = auVar4._4_4_;
  (this_00->IdxBuffer).Data = (unsigned_short *)auVar4._8_8_;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  this_00->_OwnerName = (char *)auVar3._0_8_;
  this_00->_VtxWritePtr = (ImDrawVert *)auVar3._8_8_;
  this_00->_IdxWritePtr = (ImDrawIdx *)auVar3._16_8_;
  (this_00->_ClipRectStack).Size = auVar3._24_4_;
  (this_00->_ClipRectStack).Capacity = auVar3._28_4_;
  *(undefined1 (*) [32])&(this_00->_ClipRectStack).Data = auVar3;
  *(undefined8 *)&this_00->_FringeScale = 0;
  *(undefined1 (*) [32])&(this_00->_Path).Data = auVar3;
  *(undefined1 (*) [32])&(this_00->_CmdHeader).VtxOffset = auVar3;
  this_00->_Data = pIVar1;
  ImVector<ImDrawCmd>::operator=((ImVector<ImDrawCmd> *)this_00,&this->CmdBuffer);
  ImVector<unsigned_short>::operator=(&this_00->IdxBuffer,&this->IdxBuffer);
  ImVector<ImDrawVert>::operator=(&this_00->VtxBuffer,&this->VtxBuffer);
  this_00->Flags = this->Flags;
  return this_00;
}

Assistant:

ImDrawList* ImDrawList::CloneOutput() const
{
    ImDrawList* dst = IM_NEW(ImDrawList(_Data));
    dst->CmdBuffer = CmdBuffer;
    dst->IdxBuffer = IdxBuffer;
    dst->VtxBuffer = VtxBuffer;
    dst->Flags = Flags;
    return dst;
}